

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

iter_result_opt * __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::next(iter_result_opt *__return_storage_ptr__,
      basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      *this,node_type type,uint8_t child_index)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar6;
  long lVar7;
  
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    __assert_fail("type != node_type::LEAF",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x3f3,
                  "iter_result_opt unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::next(node_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  case 1:
    if ((byte)(child_index + 1) < (this->children_count).value) {
      bVar3 = (&this->field_0xc)[(byte)(child_index + 1)];
      kVar6 = this->k_prefix;
      uVar4 = (ulong)this | 1;
LAB_00142f43:
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr = uVar4;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.key_byte = bVar3;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.child_index = child_index + '\x01';
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.prefix = (key_prefix_snapshot)kVar6;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_engaged = true;
      return __return_storage_ptr__;
    }
    goto LAB_00142fe4;
  case 2:
    if ((byte)(child_index + 1) < (this->children_count).value) {
      bVar3 = *(byte *)((long)&this[1].k_prefix + (ulong)(byte)(child_index + 1));
      kVar6 = this->k_prefix;
      uVar4 = (ulong)this | 2;
      goto LAB_00142f43;
    }
    goto LAB_00142fe4;
  case 3:
    uVar5 = (ulong)child_index - 1;
    do {
      if (uVar5 == 0xfe) goto LAB_00142fe4;
      uVar4 = uVar5 + 1;
      child_index = child_index + 1;
      pcVar1 = &this->field_0xb + uVar5;
      uVar5 = uVar4;
    } while (*pcVar1 == -1);
    kVar6 = this->k_prefix;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.node.tagged_ptr = (ulong)this | 3;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.key_byte = child_index;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.child_index = child_index;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.prefix = (key_prefix_snapshot)kVar6;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_engaged = true;
    break;
  case 4:
    lVar2 = (ulong)child_index + 3;
    do {
      lVar7 = lVar2;
      if (lVar7 == 0x102) goto LAB_00142fe4;
      child_index = child_index + 1;
      lVar2 = lVar7 + 1;
    } while ((&this->k_prefix)[lVar7] ==
             (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              )0x0);
    uVar4 = lVar7 - 3;
    kVar6 = this->k_prefix;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.node.tagged_ptr = (ulong)this | 4;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.key_byte = child_index;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.child_index = child_index;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.prefix = (key_prefix_snapshot)kVar6;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_engaged = true;
    break;
  default:
    basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
    ::next();
  }
  if (uVar4 < 0xff) {
    return __return_storage_ptr__;
  }
LAB_00142fe4:
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.node.tagged_ptr = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>)
           ._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
           _M_payload + 8) = 0;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.prefix.u64 = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_engaged = 0;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr iter_result_opt next(
      node_type type, std::uint8_t child_index) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->next(child_index);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->next(child_index);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->next(child_index);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->next(child_index);
      // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }